

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O2

void __thiscall antlr::TokenBuffer::fill(TokenBuffer *this,uint amount)

{
  value_type vStack_28;
  
  syncConsume(this);
  while (((long)(this->queue).storage.
                super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->queue).storage.
                super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) - (this->queue).m_offset <
         (ulong)(this->markerOffset + amount)) {
    (**this->input->_vptr_TokenStream)(&vStack_28);
    std::
    vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ::push_back(&(this->queue).storage,&vStack_28);
    TokenRefCount<antlr::Token>::~TokenRefCount(&vStack_28);
  }
  return;
}

Assistant:

void TokenBuffer::fill(unsigned int amount)
{
	syncConsume();
	// Fill the buffer sufficiently to hold needed tokens
	while (queue.entries() < (amount + markerOffset))
	{
		// Append the next token
		queue.append(input.nextToken());
	}
}